

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

void Qentem::TestOutPut::ResetDoubleFormat(void)

{
  uint *puVar1;
  long lVar2;
  long *plVar3;
  
  lVar2 = std::wcout;
  plVar3 = GetStreamCache[abi:cxx11]()::wss_abi_cxx11_;
  if (GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == (long *)0x0) {
    plVar3 = &std::wcout;
    *(uint *)(std::ios_base::Init::Init + *(long *)(std::wcout + -0x18)) =
         *(uint *)(std::ios_base::Init::Init + *(long *)(std::wcout + -0x18)) & 0xfffffefb;
  }
  else {
    puVar1 = (uint *)((long)GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ +
                     *(long *)(GetStreamCache[abi:cxx11]()::wss_abi_cxx11_[2] + -0x18) + 0x28);
    *puVar1 = *puVar1 & 0xfffffefb;
    lVar2 = *plVar3;
  }
  *(undefined8 *)((long)plVar3 + *(long *)(lVar2 + -0x18) + 8) = 6;
  return;
}

Assistant:

static void ResetDoubleFormat() noexcept {
        std::wstringstream *wss = GetStreamCache();

        if (wss == nullptr) {
            std::wcout << std::defaultfloat;
            std::wcout.precision(6);
        } else {
            *wss << std::defaultfloat;
            wss->precision(6);
        }
    }